

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

int mbedtls_rsa_check_privkey(mbedtls_rsa_context *ctx)

{
  mbedtls_mpi *A;
  mbedtls_mpi *B;
  mbedtls_mpi *A_00;
  int iVar1;
  mbedtls_mpi Q1;
  mbedtls_mpi P1;
  mbedtls_mpi H;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi L2;
  mbedtls_mpi L1;
  mbedtls_mpi G2;
  mbedtls_mpi G;
  mbedtls_mpi I;
  mbedtls_mpi DE;
  mbedtls_mpi PQ;
  mbedtls_mpi mStack_168;
  mbedtls_mpi local_150;
  mbedtls_mpi local_138;
  mbedtls_mpi local_120;
  mbedtls_mpi local_108;
  mbedtls_mpi local_f0;
  mbedtls_mpi local_d8;
  mbedtls_mpi local_c0;
  mbedtls_mpi local_a8;
  mbedtls_mpi local_90;
  mbedtls_mpi local_78;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  iVar1 = mbedtls_rsa_check_pubkey(ctx);
  if ((((iVar1 == 0) && (iVar1 = -0x4200, (ctx->P).p != (mbedtls_mpi_uint *)0x0)) &&
      ((ctx->Q).p != (mbedtls_mpi_uint *)0x0)) && ((ctx->D).p != (mbedtls_mpi_uint *)0x0)) {
    A = &ctx->P;
    B = &ctx->Q;
    mbedtls_mpi_init(&local_48);
    mbedtls_mpi_init(&local_60);
    mbedtls_mpi_init(&local_150);
    mbedtls_mpi_init(&mStack_168);
    mbedtls_mpi_init(&local_138);
    mbedtls_mpi_init(&local_78);
    mbedtls_mpi_init(&local_90);
    mbedtls_mpi_init(&local_a8);
    mbedtls_mpi_init(&local_c0);
    mbedtls_mpi_init(&local_d8);
    mbedtls_mpi_init(&local_f0);
    mbedtls_mpi_init(&local_108);
    mbedtls_mpi_init(&local_120);
    iVar1 = mbedtls_mpi_mul_mpi(&local_48,A,B);
    if (iVar1 == 0) {
      A_00 = &ctx->D;
      iVar1 = mbedtls_mpi_mul_mpi(&local_60,A_00,&ctx->E);
      if ((((iVar1 == 0) && (iVar1 = mbedtls_mpi_sub_int(&local_150,A,1), iVar1 == 0)) &&
          ((iVar1 = mbedtls_mpi_sub_int(&mStack_168,B,1), iVar1 == 0 &&
           ((iVar1 = mbedtls_mpi_mul_mpi(&local_138,&local_150,&mStack_168), iVar1 == 0 &&
            (iVar1 = mbedtls_mpi_gcd(&local_90,&ctx->E,&local_138), iVar1 == 0)))))) &&
         ((iVar1 = mbedtls_mpi_gcd(&local_a8,&local_150,&mStack_168), iVar1 == 0 &&
          ((((iVar1 = mbedtls_mpi_div_mpi(&local_c0,&local_d8,&local_138,&local_a8), iVar1 == 0 &&
             (iVar1 = mbedtls_mpi_mod_mpi(&local_78,&local_60,&local_c0), iVar1 == 0)) &&
            (iVar1 = mbedtls_mpi_mod_mpi(&local_f0,A_00,&local_150), iVar1 == 0)) &&
           ((iVar1 = mbedtls_mpi_mod_mpi(&local_108,A_00,&mStack_168), iVar1 == 0 &&
            (iVar1 = mbedtls_mpi_inv_mod(&local_120,B,A), iVar1 == 0)))))))) {
        iVar1 = mbedtls_mpi_cmp_mpi(&local_48,&ctx->N);
        if ((((iVar1 == 0) &&
             ((iVar1 = mbedtls_mpi_cmp_mpi(&local_f0,&ctx->DP), iVar1 == 0 &&
              (iVar1 = mbedtls_mpi_cmp_mpi(&local_108,&ctx->DQ), iVar1 == 0)))) &&
            (iVar1 = mbedtls_mpi_cmp_mpi(&local_120,&ctx->QP), iVar1 == 0)) &&
           (((iVar1 = mbedtls_mpi_cmp_int(&local_d8,0), iVar1 == 0 &&
             (iVar1 = mbedtls_mpi_cmp_int(&local_78,1), iVar1 == 0)) &&
            (iVar1 = mbedtls_mpi_cmp_int(&local_90,1), iVar1 == 0)))) {
          iVar1 = 0;
        }
        else {
          iVar1 = -0x4200;
        }
      }
    }
    mbedtls_mpi_free(&local_48);
    mbedtls_mpi_free(&local_60);
    mbedtls_mpi_free(&local_150);
    mbedtls_mpi_free(&mStack_168);
    mbedtls_mpi_free(&local_138);
    mbedtls_mpi_free(&local_78);
    mbedtls_mpi_free(&local_90);
    mbedtls_mpi_free(&local_a8);
    mbedtls_mpi_free(&local_c0);
    mbedtls_mpi_free(&local_d8);
    mbedtls_mpi_free(&local_f0);
    mbedtls_mpi_free(&local_108);
    mbedtls_mpi_free(&local_120);
    if ((iVar1 != -0x4200) && (iVar1 != 0)) {
      iVar1 = iVar1 + -0x4200;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_check_privkey( const mbedtls_rsa_context *ctx )
{
    int ret;
    mbedtls_mpi PQ, DE, P1, Q1, H, I, G, G2, L1, L2, DP, DQ, QP;

    if( ( ret = mbedtls_rsa_check_pubkey( ctx ) ) != 0 )
        return( ret );

    if( !ctx->P.p || !ctx->Q.p || !ctx->D.p )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    mbedtls_mpi_init( &PQ ); mbedtls_mpi_init( &DE ); mbedtls_mpi_init( &P1 ); mbedtls_mpi_init( &Q1 );
    mbedtls_mpi_init( &H  ); mbedtls_mpi_init( &I  ); mbedtls_mpi_init( &G  ); mbedtls_mpi_init( &G2 );
    mbedtls_mpi_init( &L1 ); mbedtls_mpi_init( &L2 ); mbedtls_mpi_init( &DP ); mbedtls_mpi_init( &DQ );
    mbedtls_mpi_init( &QP );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &PQ, &ctx->P, &ctx->Q ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &DE, &ctx->D, &ctx->E ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &P1, &ctx->P, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &Q1, &ctx->Q, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &H, &P1, &Q1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G, &ctx->E, &H  ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G2, &P1, &Q1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_div_mpi( &L1, &L2, &H, &G2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &I, &DE, &L1  ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &DP, &ctx->D, &P1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &DQ, &ctx->D, &Q1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &QP, &ctx->Q, &ctx->P ) );
    /*
     * Check for a valid PKCS1v2 private key
     */
    if( mbedtls_mpi_cmp_mpi( &PQ, &ctx->N ) != 0 ||
        mbedtls_mpi_cmp_mpi( &DP, &ctx->DP ) != 0 ||
        mbedtls_mpi_cmp_mpi( &DQ, &ctx->DQ ) != 0 ||
        mbedtls_mpi_cmp_mpi( &QP, &ctx->QP ) != 0 ||
        mbedtls_mpi_cmp_int( &L2, 0 ) != 0 ||
        mbedtls_mpi_cmp_int( &I, 1 ) != 0 ||
        mbedtls_mpi_cmp_int( &G, 1 ) != 0 )
    {
        ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

cleanup:
    mbedtls_mpi_free( &PQ ); mbedtls_mpi_free( &DE ); mbedtls_mpi_free( &P1 ); mbedtls_mpi_free( &Q1 );
    mbedtls_mpi_free( &H  ); mbedtls_mpi_free( &I  ); mbedtls_mpi_free( &G  ); mbedtls_mpi_free( &G2 );
    mbedtls_mpi_free( &L1 ); mbedtls_mpi_free( &L2 ); mbedtls_mpi_free( &DP ); mbedtls_mpi_free( &DQ );
    mbedtls_mpi_free( &QP );

    if( ret == MBEDTLS_ERR_RSA_KEY_CHECK_FAILED )
        return( ret );

    if( ret != 0 )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED + ret );

    return( 0 );
}